

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.hpp
# Opt level: O2

void __thiscall peach::interpreter::Interpreter::popIndentation(Interpreter *this)

{
  element_type *peVar1;
  _Elt_pointer pUVar2;
  ExprShPtr expr;
  __shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<peach::expression::Expression,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  pUVar2 = (this->unfinishedExpressions_).c.
           super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pUVar2 == (this->unfinishedExpressions_).c.
                super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pUVar2 = (this->unfinishedExpressions_).c.
             super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
  }
  std::__shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,
             (__shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2> *)
             (pUVar2 + -1));
  pUVar2 = (this->unfinishedExpressions_).c.
           super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pUVar2 == (this->unfinishedExpressions_).c.
                super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pUVar2 = (this->unfinishedExpressions_).c.
             super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
  }
  std::__shared_ptr<peach::expression::Expression,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<peach::expression::ExpressionSequence,void>
            (local_30,&pUVar2[-1].sequence.
                       super___shared_ptr<peach::expression::ExpressionSequence,_(__gnu_cxx::_Lock_policy)2>
            );
  (*(local_50._M_ptr)->_vptr_Expression[1])(local_50._M_ptr,local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  std::
  deque<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
  ::pop_back(&(this->unfinishedExpressions_).c);
  pUVar2 = (this->unfinishedExpressions_).c.
           super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pUVar2 == (this->unfinishedExpressions_).c.
                super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pUVar2 = (this->unfinishedExpressions_).c.
             super__Deque_base<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
  }
  peVar1 = pUVar2[-1].sequence.
           super___shared_ptr<peach::expression::ExpressionSequence,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&local_50);
  std::
  vector<std::shared_ptr<peach::expression::Expression>,std::allocator<std::shared_ptr<peach::expression::Expression>>>
  ::emplace_back<std::shared_ptr<peach::expression::Expression>>
            ((vector<std::shared_ptr<peach::expression::Expression>,std::allocator<std::shared_ptr<peach::expression::Expression>>>
              *)&peVar1->exprs_,(shared_ptr<peach::expression::Expression> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return;
}

Assistant:

void popIndentation()
    {
        auto expr = unfinishedExpressions_.top().expression;
        expr->addExpressionFromNextIndentationLevel(unfinishedExpressions_.top().sequence);
        unfinishedExpressions_.pop();
        unfinishedExpressions_.top().sequence->addExpression(expr);
    }